

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

bool cashew::JSPrinter::isBlock(Ref node)

{
  undefined1 uVar1;
  Ref *this;
  Value *local_10;
  Ref node_local;
  
  if (((node.inst)->type == Array) &&
     (((((node.inst)->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
      usedElements != 0)) {
    local_10 = node.inst;
    this = (Ref *)cashew::Ref::operator[]((uint)&local_10);
    uVar1 = cashew::Ref::operator==(this,(IString *)&BLOCK);
  }
  else {
    uVar1 = 0;
  }
  return (bool)uVar1;
}

Assistant:

static bool isBlock(Ref node) {
    return node->isArray() && !node->empty() && node[0] == BLOCK;
  }